

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFanout.c
# Opt level: O2

Ivy_Obj_t * Ivy_ObjNextFanout(Ivy_Obj_t *pObj,Ivy_Obj_t *pFanout)

{
  uint __line;
  Ivy_Obj_t *pIVar1;
  char *__assertion;
  long lStack_10;
  
  if (((ulong)pObj & 1) == 0) {
    if (((ulong)pFanout & 1) == 0) {
      if (pFanout == (Ivy_Obj_t *)0x0) {
        pIVar1 = (Ivy_Obj_t *)0x0;
      }
      else {
        if ((Ivy_Obj_t *)((ulong)pFanout->pFanin0 & 0xfffffffffffffffe) == pObj) {
          lStack_10 = 0x28;
        }
        else {
          if ((Ivy_Obj_t *)((ulong)pFanout->pFanin1 & 0xfffffffffffffffe) != pObj) {
            __assertion = "Ivy_ObjFanin1(pFanout) == pObj";
            __line = 0x27;
            goto LAB_00650a96;
          }
          lStack_10 = 0x30;
        }
        pIVar1 = *(Ivy_Obj_t **)((long)&pFanout->Id + lStack_10);
      }
      return pIVar1;
    }
    __assertion = "!Ivy_IsComplement(pFanout)";
    __line = 0x22;
  }
  else {
    __assertion = "!Ivy_IsComplement(pObj)";
    __line = 0x21;
  }
LAB_00650a96:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFanout.c"
                ,__line,"Ivy_Obj_t *Ivy_ObjNextFanout(Ivy_Obj_t *, Ivy_Obj_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

// getting hold of the next fanout of the node
static inline Ivy_Obj_t * Ivy_ObjNextFanout( Ivy_Obj_t * pObj, Ivy_Obj_t * pFanout )
{
    assert( !Ivy_IsComplement(pObj) );
    assert( !Ivy_IsComplement(pFanout) );
    if ( pFanout == NULL )
        return NULL;
    if ( Ivy_ObjFanin0(pFanout) == pObj )
        return pFanout->pNextFan0;
    assert( Ivy_ObjFanin1(pFanout) == pObj );
    return pFanout->pNextFan1;
}